

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *param_2,bool firstForConfig)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *this_00;
  cmGlobalNinjaGenerator *pcVar1;
  mapped_type *pmVar2;
  cmGeneratedFileStream *os;
  cmNinjaBuild build;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  undefined1 local_148 [288];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"phony",(allocator<char> *)&local_188);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1a8,&this->super_cmNinjaTargetGenerator);
  cmStrCat<char_const(&)[29],std::__cxx11::string>
            (&local_188,(char (*) [29])"Imported C++ module library ",&local_1a8);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (cmNinjaDeps *)(local_148 + 0x40),config);
  if (firstForConfig) {
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
             ::operator[](&pcVar1->Configs,config);
    cmLocalNinjaGenerator::AppendTargetOutputs
              (this_00,target,&pmVar2->ByproductsForCleanTarget,config);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"CXX",&local_1a9);
  cmNinjaTargetGenerator::GetDyndepFilePath
            (&local_188,&this->super_cmNinjaTargetGenerator,&local_1a8,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_148 + 0x88)
             ,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar1,(ostream *)os,(cmNinjaBuild *)local_148,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_148);
  pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)local_148,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias
            (pcVar1,(string *)local_148,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  std::__cxx11::string::~string((string *)local_148);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement(
  const std::string& config, const std::string& /*fileConfig*/,
  bool firstForConfig)
{
  // TODO: How to use `fileConfig` properly?

  // Write a phony output that depends on the scanning output.
  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Imported C++ module library ", this->GetTargetName());
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs, config);
    if (firstForConfig) {
      this->GetLocalGenerator()->AppendTargetOutputs(
        this->GetGeneratorTarget(),
        this->GetGlobalGenerator()->GetByproductsForCleanTarget(config),
        config);
    }
    build.ExplicitDeps.emplace_back(this->GetDyndepFilePath("CXX", config));
    this->GetGlobalGenerator()->WriteBuild(this->GetCommonFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(
    this->GetTargetName(), this->GetGeneratorTarget(), config);
}